

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MT.h
# Opt level: O3

int FindLatestMTMessage(uchar *buf,int buflen,int addr,int mid,uchar **pFoundMsg,
                       int *pFoundMsgTmpLen)

{
  byte bVar1;
  uint uVar2;
  char cVar3;
  ulong uVar4;
  bool bVar5;
  
  do {
    if (buflen < 5) break;
    if ((((*buf == 0xfa) && (buf[1] == (uchar)addr)) && (buf[2] == (uchar)mid)) &&
       (bVar1 = buf[3], 6 < (uint)buflen || bVar1 != 0xff)) {
      if (bVar1 == 0xff) {
        uVar2 = (ushort)(*(ushort *)(buf + 4) << 8 | *(ushort *)(buf + 4) >> 8) + 7;
      }
      else {
        uVar2 = bVar1 + 5;
      }
      if (uVar2 <= (uint)buflen) {
        uVar4 = 1;
        cVar3 = '\0';
        do {
          cVar3 = cVar3 + buf[uVar4];
          uVar4 = uVar4 + 1;
        } while (uVar2 != uVar4);
        if (cVar3 == '\0') {
LAB_001b8f11:
          *pFoundMsg = buf;
          *pFoundMsgTmpLen = buflen;
          if (buf[3] == 0xff) {
            uVar2 = (ushort)(*(ushort *)(buf + 4) << 8 | *(ushort *)(buf + 4) >> 8) + 7;
          }
          else {
            uVar2 = buf[3] + 5;
          }
          buf = buf + uVar2;
          buflen = buflen - uVar2;
          do {
            if (buflen < 5) {
              return 0;
            }
            if (((*buf == 0xfa) && (buf[1] == (uchar)addr)) &&
               ((buf[2] == (uchar)mid && ((bVar1 = buf[3], 6 < (uint)buflen || (bVar1 != 0xff))))))
            {
              if (bVar1 == 0xff) {
                uVar2 = (ushort)(*(ushort *)(buf + 4) << 8 | *(ushort *)(buf + 4) >> 8) + 7;
              }
              else {
                uVar2 = bVar1 + 5;
              }
              if (uVar2 <= (uint)buflen) {
                uVar4 = 1;
                cVar3 = '\0';
                do {
                  cVar3 = cVar3 + buf[uVar4];
                  uVar4 = uVar4 + 1;
                } while (uVar2 != uVar4);
                if (cVar3 == '\0') goto LAB_001b8f11;
              }
            }
            buf = buf + 1;
            bVar5 = buflen == 5;
            buflen = buflen - 1;
            if (bVar5) {
              return 0;
            }
          } while( true );
        }
      }
    }
    buf = buf + 1;
    bVar5 = buflen != 5;
    buflen = buflen - 1;
  } while (bVar5);
  *pFoundMsg = (uchar *)0x0;
  *pFoundMsgTmpLen = 0;
  return 1;
}

Assistant:

inline int FindLatestMTMessage(unsigned char* buf, int buflen, int addr, int mid, unsigned char** pFoundMsg, int* pFoundMsgTmpLen)
{
	unsigned char* ptr = NULL;
	int len = 0;
	int msglen = 0;

	if (FindMTMessage(buf, buflen, addr, mid, &ptr, &len) != EXIT_SUCCESS)
	{
		*pFoundMsg = NULL;
		*pFoundMsgTmpLen = 0;
		return EXIT_FAILURE;
	}
	for (;;) 
	{
		// Save the position of the beginning of the message.
		*pFoundMsg = ptr;
		*pFoundMsgTmpLen = len;

		// Expected total message length.
		msglen = GetLengthMTMessage(*pFoundMsg);

		// Search just after the message.
		if (FindMTMessage(*pFoundMsg+msglen, *pFoundMsgTmpLen-msglen, 
			addr, mid, &ptr, &len) != EXIT_SUCCESS)
		{
			break;
		}
	}

	return EXIT_SUCCESS;
}